

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRules
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this)

{
  NFRuleSet *this_00;
  NFRuleSet **ppNVar1;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  ppNVar1 = this->fRuleSets;
  if (ppNVar1 != (NFRuleSet **)0x0) {
    this_00 = *ppNVar1;
    while (this_00 != (NFRuleSet *)0x0) {
      ppNVar1 = ppNVar1 + 1;
      NFRuleSet::appendRules(this_00,__return_storage_ptr__);
      this_00 = *ppNVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRules() const
{
    UnicodeString result;
    if (fRuleSets != NULL) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            (*p)->appendRules(result);
        }
    }
    return result;
}